

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

char * trim_extension(char *s)

{
  char **ppcVar1;
  char *delim_pos;
  char buffer [4096];
  char *s_local;
  
  buffer._4088_8_ = s;
  sprintf((char *)&delim_pos,"%s%c",s,0);
  ppcVar1 = (char **)strrchr((char *)&delim_pos,0x2e);
  if ((ppcVar1 == &delim_pos) || (*(char *)((long)ppcVar1 + -1) == '/')) {
    s_local = xstrdup((char *)&delim_pos);
  }
  else {
    *(char *)ppcVar1 = '\0';
    s_local = xstrdup((char *)&delim_pos);
  }
  return s_local;
}

Assistant:

const char *trim_extension(const char *s)
{
	char buffer[PATH_MAX];
	sprintf(&buffer[0], "%s%c", s, '\0');
	char *delim_pos = strrchr(buffer, '.');
	if (delim_pos == &buffer[0] || *(delim_pos - 1) == PATH_SEPARATOR) {
		return xstrdup(&buffer[0]);
	}
	*delim_pos = '\0';
	return xstrdup(&buffer[0]);
}